

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCases.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::Texture2DRenderCase::setupProgram
          (Texture2DRenderCase *this,deUint32 program)

{
  code *pcVar1;
  deUint32 dVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined4 local_28;
  int local_24;
  int samplerLoc;
  int texNdx;
  Functions *gl;
  Texture2DRenderCase *pTStack_10;
  deUint32 program_local;
  Texture2DRenderCase *this_local;
  
  gl._4_4_ = program;
  pTStack_10 = this;
  iVar3 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[3])();
  _samplerLoc = CONCAT44(extraout_var,iVar3);
  for (local_24 = 0; dVar2 = gl._4_4_, local_24 < this->m_numTextures; local_24 = local_24 + 1) {
    pcVar1 = *(code **)(_samplerLoc + 0xb48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"u_sampler",&local_69);
    de::toString<int>(&local_a0,&local_24);
    std::operator+(&local_48,&local_68,&local_a0);
    uVar5 = std::__cxx11::string::c_str();
    uVar4 = (*pcVar1)(dVar2,uVar5);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    local_28 = uVar4;
    (**(code **)(_samplerLoc + 0x14f0))(uVar4,local_24);
  }
  return;
}

Assistant:

void Texture2DRenderCase::setupProgram (deUint32 program)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();
	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		int samplerLoc = gl.getUniformLocation(program, (string("u_sampler") + de::toString(texNdx)).c_str());
		gl.uniform1i(samplerLoc, texNdx);
	}
}